

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::ExampleAppConsole(ExampleAppConsole *this)

{
  ImVector<const_char_*> *this_00;
  char *local_28;
  
  (this->Items).Size = 0;
  (this->Items).Capacity = 0;
  (this->Items).Data = (char **)0x0;
  (this->History).Size = 0;
  (this->History).Capacity = 0;
  (this->History).Data = (char **)0x0;
  this_00 = &this->Commands;
  (this->Commands).Size = 0;
  (this->Commands).Capacity = 0;
  (this->Commands).Data = (char **)0x0;
  ClearLog(this);
  memset(this,0,0x100);
  this->HistoryPos = -1;
  local_28 = "HELP";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  local_28 = "HISTORY";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  local_28 = "CLEAR";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  local_28 = "CLASSIFY";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  AddLog(this,"Welcome to ImGui!");
  return;
}

Assistant:

ExampleAppConsole()
    {
        ClearLog();
        memset(InputBuf, 0, sizeof(InputBuf));
        HistoryPos = -1;
        Commands.push_back("HELP");
        Commands.push_back("HISTORY");
        Commands.push_back("CLEAR");
        Commands.push_back("CLASSIFY");  // "classify" is here to provide an example of "C"+[tab] completing to "CL" and displaying matches.
        AddLog("Welcome to ImGui!");
    }